

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,long,duckdb::DefaultMapType<std::map<long,unsigned_long,std::less<long>,std::allocator<std::pair<long_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  idx_t size;
  Vector *pVVar5;
  Vector *pVVar6;
  ulong uVar7;
  _Rb_tree_node_base *p_Var8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t i_1;
  ulong uVar11;
  long lVar12;
  long lVar13;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar12 = 0;
  for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
    iVar10 = iVar9;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar10 = (idx_t)(local_78.sel)->sel_vector[iVar9];
    }
    if (**(long **)(local_78.data + iVar10 * 8) != 0) {
      lVar12 = lVar12 + *(long *)(**(long **)(local_78.data + iVar10 * 8) + 0x28);
    }
  }
  ListVector::Reserve(result,lVar12 + size);
  pVVar5 = MapVector::GetKeys(result);
  pVVar6 = MapVector::GetValues(result);
  pdVar2 = result->data;
  pdVar3 = pVVar6->data;
  for (uVar11 = 0; uVar11 != count; uVar11 = uVar11 + 1) {
    uVar7 = uVar11;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)(local_78.sel)->sel_vector[uVar11];
    }
    lVar12 = **(long **)(local_78.data + uVar7 * 8);
    if (lVar12 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,offset + uVar11);
    }
    else {
      lVar13 = (offset + uVar11) * 0x10;
      plVar1 = (long *)(pdVar2 + lVar13);
      *(idx_t *)(pdVar2 + lVar13) = size;
      pdVar4 = pVVar5->data;
      for (p_Var8 = *(_Rb_tree_node_base **)(lVar12 + 0x18);
          p_Var8 != (_Rb_tree_node_base *)(lVar12 + 8);
          p_Var8 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var8)) {
        *(undefined8 *)(pdVar4 + size * 8) = *(undefined8 *)(p_Var8 + 1);
        *(_Base_ptr *)(pdVar3 + size * 8) = p_Var8[1]._M_parent;
        size = size + 1;
      }
      plVar1[1] = size - *plVar1;
    }
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}